

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O0

void __thiscall libtorrent::mmap_disk_io::add_completed_jobs(mmap_disk_io *this,jobqueue_t *jobs)

{
  bool bVar1;
  tailqueue<libtorrent::aux::disk_job> local_60;
  undefined1 local_48 [8];
  jobqueue_t new_jobs;
  jobqueue_t completed;
  jobqueue_t *jobs_local;
  mmap_disk_io *this_local;
  
  libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::tailqueue
            ((tailqueue<libtorrent::aux::disk_job> *)&new_jobs.m_size,jobs);
  do {
    libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::tailqueue
              ((tailqueue<libtorrent::aux::disk_job> *)local_48);
    libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::tailqueue
              (&local_60,(tailqueue<libtorrent::aux::disk_job> *)&new_jobs.m_size);
    add_completed_jobs_impl(this,&local_60,(jobqueue_t *)local_48);
    libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::operator=
              ((tailqueue<libtorrent::aux::disk_job> *)&new_jobs.m_size,
               (tailqueue<libtorrent::aux::disk_job> *)local_48);
    bVar1 = libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::empty
                      ((tailqueue<libtorrent::aux::disk_job> *)&new_jobs.m_size);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void mmap_disk_io::add_completed_jobs(jobqueue_t jobs)
	{
		jobqueue_t completed = std::move(jobs);
		do
		{
			// when a job completes, it's possible for it to cause
			// a fence to be lowered, issuing the jobs queued up
			// behind the fence
			jobqueue_t new_jobs;
			add_completed_jobs_impl(std::move(completed), new_jobs);
			TORRENT_ASSERT(completed.empty());
			completed = std::move(new_jobs);
		} while (!completed.empty());
	}